

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

char * convertLatin1toUTF8(char *source)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  
  sVar3 = 1;
  for (pcVar1 = source; *pcVar1 != '\0'; pcVar1 = pcVar1 + 1) {
    sVar3 = (sVar3 - (-1 < *pcVar1)) + 2;
  }
  pcVar2 = (char *)_glfw_calloc(sVar3,1);
  pcVar1 = pcVar2;
  for (; *source != '\0'; source = source + 1) {
    sVar3 = _glfwEncodeUTF8(pcVar1,(int)*source);
    pcVar1 = pcVar1 + sVar3;
  }
  return pcVar2;
}

Assistant:

static char* convertLatin1toUTF8(const char* source)
{
    size_t size = 1;
    const char* sp;

    for (sp = source;  *sp;  sp++)
        size += (*sp & 0x80) ? 2 : 1;

    char* target = _glfw_calloc(size, 1);
    char* tp = target;

    for (sp = source;  *sp;  sp++)
        tp += _glfwEncodeUTF8(tp, *sp);

    return target;
}